

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnAtomicStoreExpr
          (ExprVisitorDelegate *this,AtomicStoreExpr *expr)

{
  AtomicStoreExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  (anonymous_namespace)::WatWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
            ((WatWriter *)this->writer_,(Expr *)expr);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnAtomicStoreExpr(
    AtomicStoreExpr* expr) {
  writer_->WriteLoadStoreExpr<AtomicStoreExpr>(expr);
  return Result::Ok;
}